

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O0

PatternList *
parse_atom(PatternList *__return_storage_ptr__,Tokens *tokens,
          vector<docopt::Option,_std::allocator<docopt::Option>_> *options)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  DocoptLanguageError *pDVar3;
  bool local_27a;
  bool local_262;
  string local_220;
  undefined1 local_200 [16];
  string local_1f0;
  undefined1 local_1d0 [47];
  allocator local_1a1;
  string local_1a0;
  PatternList local_180;
  allocator local_161;
  string local_160;
  shared_ptr<docopt::OptionsShortcut> local_140;
  string local_130;
  undefined1 local_110 [16];
  undefined1 local_100 [8];
  string trailing_1;
  PatternList expr_1;
  undefined1 local_a8 [16];
  undefined1 local_98 [8];
  string trailing;
  PatternList expr;
  string local_50;
  undefined1 local_29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  string *token;
  vector<docopt::Option,_std::allocator<docopt::Option>_> *options_local;
  Tokens *tokens_local;
  PatternList *ret;
  
  token = (string *)options;
  options_local = (vector<docopt::Option,_std::allocator<docopt::Option>_> *)tokens;
  tokens_local = (Tokens *)__return_storage_ptr__;
  local_28 = Tokens::current_abi_cxx11_(tokens);
  local_29 = 0;
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::vector(__return_storage_ptr__);
  bVar2 = std::operator==(local_28,"[");
  if (bVar2) {
    Tokens::pop_abi_cxx11_(&local_50,(Tokens *)options_local);
    std::__cxx11::string::~string((string *)&local_50);
    parse_expr((PatternList *)((long)&trailing.field_2 + 8),(Tokens *)options_local,
               (vector<docopt::Option,_std::allocator<docopt::Option>_> *)token);
    Tokens::pop_abi_cxx11_((string *)local_98,(Tokens *)options_local);
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_98,"]");
    if (bVar2) {
      pDVar3 = (DocoptLanguageError *)__cxa_allocate_exception(0x10);
      docopt::DocoptLanguageError::runtime_error(pDVar3,"Mismatched \'[\'");
      __cxa_throw(pDVar3,&docopt::DocoptLanguageError::typeinfo,
                  docopt::DocoptLanguageError::~DocoptLanguageError);
    }
    std::
    make_shared<docopt::Optional,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
              ((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                *)local_a8);
    std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>::
    emplace_back<std::shared_ptr<docopt::Optional>>
              ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                *)__return_storage_ptr__,(shared_ptr<docopt::Optional> *)local_a8);
    std::shared_ptr<docopt::Optional>::~shared_ptr((shared_ptr<docopt::Optional> *)local_a8);
    std::__cxx11::string::~string((string *)local_98);
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    ~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             *)((long)&trailing.field_2 + 8));
  }
  else {
    bVar2 = std::operator==(local_28,"(");
    if (bVar2) {
      Tokens::pop_abi_cxx11_
                ((string *)
                 &expr_1.
                  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(Tokens *)options_local);
      std::__cxx11::string::~string
                ((string *)
                 &expr_1.
                  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      parse_expr((PatternList *)((long)&trailing_1.field_2 + 8),(Tokens *)options_local,
                 (vector<docopt::Option,_std::allocator<docopt::Option>_> *)token);
      Tokens::pop_abi_cxx11_((string *)local_100,(Tokens *)options_local);
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_100,")");
      if (bVar2) {
        pDVar3 = (DocoptLanguageError *)__cxa_allocate_exception(0x10);
        docopt::DocoptLanguageError::runtime_error(pDVar3,"Mismatched \'(\'");
        __cxa_throw(pDVar3,&docopt::DocoptLanguageError::typeinfo,
                    docopt::DocoptLanguageError::~DocoptLanguageError);
      }
      std::
      make_shared<docopt::Required,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
                ((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                  *)local_110);
      std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
      ::emplace_back<std::shared_ptr<docopt::Required>>
                ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                  *)__return_storage_ptr__,(shared_ptr<docopt::Required> *)local_110);
      std::shared_ptr<docopt::Required>::~shared_ptr((shared_ptr<docopt::Required> *)local_110);
      std::__cxx11::string::~string((string *)local_100);
      std::
      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
      ~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               *)((long)&trailing_1.field_2 + 8));
    }
    else {
      bVar2 = std::operator==(local_28,"options");
      pbVar1 = local_28;
      if (bVar2) {
        Tokens::pop_abi_cxx11_(&local_130,(Tokens *)options_local);
        std::__cxx11::string::~string((string *)&local_130);
        std::make_shared<docopt::OptionsShortcut>();
        std::
        vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>::
        emplace_back<std::shared_ptr<docopt::OptionsShortcut>>
                  ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                    *)__return_storage_ptr__,&local_140);
        std::shared_ptr<docopt::OptionsShortcut>::~shared_ptr(&local_140);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_160,"--",&local_161);
        bVar2 = anon_unknown.dwarf_108a86::starts_with(pbVar1,&local_160);
        local_262 = false;
        if (bVar2) {
          local_262 = std::operator!=(local_28,"--");
        }
        std::__cxx11::string::~string((string *)&local_160);
        std::allocator<char>::~allocator((allocator<char> *)&local_161);
        pbVar1 = local_28;
        if (local_262 == false) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_1a0,"-",&local_1a1);
          bVar2 = anon_unknown.dwarf_108a86::starts_with(pbVar1,&local_1a0);
          local_27a = false;
          if (bVar2) {
            bVar2 = std::operator!=(local_28,"-");
            local_27a = false;
            if (bVar2) {
              local_27a = std::operator!=(local_28,"--");
            }
          }
          std::__cxx11::string::~string((string *)&local_1a0);
          std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
          if (local_27a == false) {
            bVar2 = is_argument_spec(local_28);
            if (bVar2) {
              Tokens::pop_abi_cxx11_((string *)(local_200 + 0x10),(Tokens *)options_local);
              std::make_shared<docopt::Argument,std::__cxx11::string>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1d0);
              std::
              vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
              ::emplace_back<std::shared_ptr<docopt::Argument>>
                        ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                          *)__return_storage_ptr__,(shared_ptr<docopt::Argument> *)local_1d0);
              std::shared_ptr<docopt::Argument>::~shared_ptr
                        ((shared_ptr<docopt::Argument> *)local_1d0);
              std::__cxx11::string::~string((string *)(local_200 + 0x10));
            }
            else {
              Tokens::pop_abi_cxx11_(&local_220,(Tokens *)options_local);
              std::make_shared<docopt::Command,std::__cxx11::string>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_200);
              std::
              vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
              ::emplace_back<std::shared_ptr<docopt::Command>>
                        ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                          *)__return_storage_ptr__,(shared_ptr<docopt::Command> *)local_200);
              std::shared_ptr<docopt::Command>::~shared_ptr
                        ((shared_ptr<docopt::Command> *)local_200);
              std::__cxx11::string::~string((string *)&local_220);
            }
          }
          else {
            parse_short((PatternList *)(local_1d0 + 0x10),(Tokens *)options_local,
                        (vector<docopt::Option,_std::allocator<docopt::Option>_> *)token);
            std::
            vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            ::operator=(__return_storage_ptr__,
                        (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                         *)(local_1d0 + 0x10));
            std::
            vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                       *)(local_1d0 + 0x10));
          }
        }
        else {
          parse_long(&local_180,(Tokens *)options_local,
                     (vector<docopt::Option,_std::allocator<docopt::Option>_> *)token);
          std::
          vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ::operator=(__return_storage_ptr__,&local_180);
          std::
          vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ::~vector(&local_180);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static PatternList parse_atom(Tokens& tokens, std::vector<Option>& options)
{
	// atom ::= '(' expr ')' | '[' expr ']' | 'options'
	//             | long | shorts | argument | command ;

	std::string const& token = tokens.current();

	PatternList ret;

	if (token == "[") {
		tokens.pop();

		auto expr = parse_expr(tokens, options);

		auto trailing = tokens.pop();
		if (trailing != "]") {
			throw DocoptLanguageError("Mismatched '['");
		}

		ret.emplace_back(std::make_shared<Optional>(std::move(expr)));
	} else if (token=="(") {
		tokens.pop();

		auto expr = parse_expr(tokens, options);

		auto trailing = tokens.pop();
		if (trailing != ")") {
			throw DocoptLanguageError("Mismatched '('");
		}

		ret.emplace_back(std::make_shared<Required>(std::move(expr)));
	} else if (token == "options") {
		tokens.pop();
		ret.emplace_back(std::make_shared<OptionsShortcut>());
	} else if (starts_with(token, "--") && token != "--") {
		ret = parse_long(tokens, options);
	} else if (starts_with(token, "-") && token != "-" && token != "--") {
		ret = parse_short(tokens, options);
	} else if (is_argument_spec(token)) {
		ret.emplace_back(std::make_shared<Argument>(tokens.pop()));
	} else {
		ret.emplace_back(std::make_shared<Command>(tokens.pop()));
	}

	return ret;
}